

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoMemoryInit(Thread *this,Instr instr,Ptr *out_trap)

{
  bool bVar1;
  pointer pDVar2;
  Store *this_00;
  Memory *this_01;
  Result RVar3;
  RunResult RVar4;
  ulong dst_offset;
  Value VVar5;
  Value VVar6;
  Value VVar7;
  RefPtr<wabt::interp::Memory> local_88;
  Ptr *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  local_70 = out_trap;
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_88,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  pDVar2 = (this->inst_->datas_).
           super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  VVar5 = Pop(this);
  VVar6 = Pop(this);
  this_01 = local_88.obj_;
  bVar1 = ((local_88.obj_)->type_).limits.is_64;
  VVar7 = Pop(this);
  dst_offset = (ulong)VVar7.field_0.i32_;
  if (bVar1 != false) {
    dst_offset = VVar7.field_0.i64_;
  }
  RVar3 = Memory::Init(this_01,dst_offset,pDVar2 + instr.field_2.imm_u32x2.snd,
                       VVar6.field_0.i64_ & 0xffffffff,VVar5.field_0.i64_ & 0xffffffff);
  RVar4 = Ok;
  if (RVar3.enum_ == Error) {
    this_00 = this->store_;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"out of bounds memory access: memory.init out of bounds","");
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    local_70->obj_ = local_48.obj_;
    local_70->store_ = local_48.store_;
    local_70->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RVar4 = Trap;
  }
  if (local_88.obj_ != (Memory *)0x0) {
    Store::DeleteRoot(local_88.store_,local_88.root_index_);
  }
  return RVar4;
}

Assistant:

RunResult Thread::DoMemoryInit(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  auto&& data = inst_->datas()[instr.imm_u32x2.snd];
  auto size = Pop<u32>();
  auto src = Pop<u32>();
  auto dst = PopPtr(memory);
  TRAP_IF(Failed(memory->Init(dst, data, src, size)),
          "out of bounds memory access: memory.init out of bounds");
  return RunResult::Ok;
}